

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuTexLookupVerifier.cpp
# Opt level: O2

Vector<float,_4> __thiscall
tcu::lookup<float>(tcu *this,ConstPixelBufferAccess *access,Sampler *sampler,int i,int j,int k)

{
  bool bVar1;
  undefined8 extraout_XMM0_Qa;
  Vec4 VVar3;
  Vector<float,_4> VVar4;
  Vec4 p;
  Vec4 local_40;
  undefined1 auVar5 [12];
  undefined8 uVar6;
  undefined8 uVar2;
  
  bVar1 = coordsInBounds(access,i,j,k);
  if (bVar1) {
    VVar3 = ConstPixelBufferAccess::getPixel((ConstPixelBufferAccess *)&local_40,(int)access,i,j);
    uVar2 = VVar3.m_data._8_8_;
    bVar1 = isSRGB(access->m_format);
    if (bVar1) {
      VVar3 = sRGBToLinear(this,&local_40);
    }
    else {
      Vector<float,_4>::Vector((Vector<float,_4> *)this,&local_40);
      VVar3.m_data[2] = (float)(int)uVar2;
      VVar3.m_data[3] = (float)(int)((ulong)uVar2 >> 0x20);
      VVar3.m_data[0] = (float)(int)extraout_XMM0_Qa;
      VVar3.m_data[1] = (float)(int)((ulong)extraout_XMM0_Qa >> 0x20);
    }
  }
  else {
    VVar3.m_data = (float  [4])sampleTextureBorder<float>(this,&access->m_format,sampler);
  }
  VVar4.m_data[0] = VVar3.m_data[0];
  auVar5._4_4_ = VVar3.m_data[1];
  register0x00001240 = VVar3.m_data[2];
  register0x00001244 = VVar3.m_data[3];
  return (Vector<float,_4>)VVar4.m_data;
}

Assistant:

inline Vector<float, 4> lookup (const ConstPixelBufferAccess& access, const Sampler& sampler, int i, int j, int k)
{
	// Specialization for float lookups: sRGB conversion is performed as specified in format.
	if (coordsInBounds(access, i, j, k))
	{
		const Vec4 p = access.getPixel(i, j, k);
		return isSRGB(access.getFormat()) ? sRGBToLinear(p) : p;
	}
	else
		return sampleTextureBorder<float>(access.getFormat(), sampler);
}